

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::is_absolute(Twine *path,Style style)

{
  bool bVar1;
  bool bVar2;
  StringRef p;
  SmallString<128U> path_storage;
  StringRef local_d8;
  Twine local_c8;
  SmallVectorImpl<char> local_b0;
  undefined1 local_a0 [128];
  
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a0;
  local_d8 = Twine::toStringRef(path,&local_b0);
  Twine::Twine(&local_c8,&local_d8);
  bVar1 = has_root_directory(&local_c8,style);
  bVar2 = true;
  if (style == windows) {
    Twine::Twine(&local_c8,&local_d8);
    bVar2 = has_root_name(&local_c8,windows);
  }
  if ((undefined1 *)
      local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_a0) {
    free(local_b0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool is_absolute(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  bool rootDir = has_root_directory(p, style);
  bool rootName =
      (real_style(style) != Style::windows) || has_root_name(p, style);

  return rootDir && rootName;
}